

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiNullHandleTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::(anonymous_namespace)::test<vk::Handle<(vk::HandleType)19>>
          (TestStatus *__return_storage_ptr__,_anonymous_namespace_ *this,Context *context)

{
  Handle<(vk::HandleType)19> context_00;
  VkAllocationCallbacks *pVVar1;
  size_t sVar2;
  undefined1 local_88 [8];
  AllocationCallbackRecorder recordingAllocator;
  VkAllocationCallbacks *pNullAllocator;
  Handle<(vk::HandleType)19> nullHandle;
  Context *context_local;
  
  nullHandle.m_internal = (deUint64)this;
  ::vk::Handle<(vk::HandleType)19>::Handle((Handle<(vk::HandleType)19> *)&pNullAllocator,0);
  recordingAllocator.m_records.m_last = (Block *)0x0;
  pVVar1 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_88,pVVar1,1);
  api::anon_unknown_1::release
            ((Context *)nullHandle.m_internal,(VkDescriptorSetLayout)pNullAllocator,
             (VkAllocationCallbacks *)recordingAllocator.m_records.m_last);
  context_00 = nullHandle;
  pVVar1 = ::vk::AllocationCallbacks::getCallbacks((AllocationCallbacks *)local_88);
  api::anon_unknown_1::release
            ((Context *)context_00.m_internal,(VkDescriptorSetLayout)pNullAllocator,pVVar1);
  sVar2 = ::vk::AllocationCallbackRecorder::getNumRecords((AllocationCallbackRecorder *)local_88);
  api::anon_unknown_1::reportStatus(__return_storage_ptr__,sVar2 == 0);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_88);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context)
{
	const Object					nullHandle			= DE_NULL;
	const VkAllocationCallbacks*	pNullAllocator		= DE_NULL;
	AllocationCallbackRecorder		recordingAllocator	(getSystemAllocator(), 1u);

	// Implementation should silently ignore a delete/free of a NULL handle.

	release(context, nullHandle, pNullAllocator);
	release(context, nullHandle, recordingAllocator.getCallbacks());

	return reportStatus(recordingAllocator.getNumRecords() == 0);
}